

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::RawBufferCopySync_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  uint32 uVar1;
  uint32 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  JsRTRawBufferCopyAction *pJVar7;
  Var aValue;
  Var aValue_00;
  ArrayBuffer *pAVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte *srcBuff;
  byte *dstBuff;
  Var src;
  Var dst;
  JsRTRawBufferCopyAction *action;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  pJVar7 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTRawBufferCopyAction,(TTD::NSLogEvents::EventKind)62>
                     (evt);
  aValue = InflateVarInReplay(executeContext,pJVar7->Dst);
  aValue_00 = InflateVarInReplay(executeContext,pJVar7->Src);
  bVar3 = Js::VarIs<Js::ArrayBuffer>(aValue);
  if ((!bVar3) || (bVar3 = Js::VarIs<Js::ArrayBuffer>(aValue_00), !bVar3)) {
    TTDAbort_unrecoverable_error("Not array buffer objects!!!");
  }
  uVar1 = pJVar7->DstIndx;
  uVar2 = pJVar7->Count;
  pAVar8 = Js::VarTo<Js::ArrayBuffer>(aValue);
  uVar4 = (*(pAVar8->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    ();
  if (uVar4 < uVar1 + uVar2) {
    TTDAbort_unrecoverable_error("Copy off end of buffer!!!");
  }
  uVar1 = pJVar7->SrcIndx;
  uVar2 = pJVar7->Count;
  pAVar8 = Js::VarTo<Js::ArrayBuffer>(aValue_00);
  uVar4 = (*(pAVar8->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    ();
  if (uVar1 + uVar2 <= uVar4) {
    pAVar8 = Js::VarTo<Js::ArrayBuffer>(aValue);
    iVar5 = (*(pAVar8->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    uVar4 = pJVar7->DstIndx;
    pAVar8 = Js::VarTo<Js::ArrayBuffer>(aValue_00);
    iVar6 = (*(pAVar8->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    memmove_xplat((void *)(CONCAT44(extraout_var,iVar5) + (ulong)uVar4),
                  (void *)(CONCAT44(extraout_var_00,iVar6) + (ulong)pJVar7->SrcIndx),
                  (ulong)pJVar7->Count);
    return;
  }
  TTDAbort_unrecoverable_error("Copy off end of buffer!!!");
}

Assistant:

void RawBufferCopySync_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTRawBufferCopyAction* action = GetInlineEventDataAs<JsRTRawBufferCopyAction, EventKind::RawBufferCopySync>(evt);
            Js::Var dst = InflateVarInReplay(executeContext, action->Dst); //never cross context
            Js::Var src = InflateVarInReplay(executeContext, action->Src); //never cross context

            TTDAssert(Js::VarIs<Js::ArrayBuffer>(dst) && Js::VarIs<Js::ArrayBuffer>(src), "Not array buffer objects!!!");
            TTDAssert(action->DstIndx + action->Count <= Js::VarTo<Js::ArrayBuffer>(dst)->GetByteLength(), "Copy off end of buffer!!!");
            TTDAssert(action->SrcIndx + action->Count <= Js::VarTo<Js::ArrayBuffer>(src)->GetByteLength(), "Copy off end of buffer!!!");

            byte* dstBuff = Js::VarTo<Js::ArrayBuffer>(dst)->GetBuffer() + action->DstIndx;
            byte* srcBuff = Js::VarTo<Js::ArrayBuffer>(src)->GetBuffer() + action->SrcIndx;

            //node uses mmove so we do too
            memmove(dstBuff, srcBuff, action->Count);
        }